

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  cmGlobalGenerator *gg;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string local_380;
  string *local_360;
  string *local_358;
  string *local_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328 [2];
  size_type local_318 [2];
  cmWorkingDirectory workdir;
  cmake cm;
  
  this->IsSourceFileTryCompile = fast;
  local_360 = srcdir;
  bVar2 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar2) {
    cmsys::SystemTools::MakeDirectory((bindir->_M_dataplus)._M_p);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  cmake::cmake(&cm,RoleProject);
  cmake::SetIsInTryCompile(&cm,true);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_380);
  local_358 = projectName;
  local_350 = targetName;
  gg = cmake::CreateGlobalGenerator(&cm,&local_380);
  paVar1 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (gg == (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_328);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x54a178);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_338 = *plVar6;
      lStack_330 = plVar5[3];
      local_348 = &local_338;
    }
    else {
      local_338 = *plVar6;
      local_348 = (long *)*plVar5;
    }
    local_340 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_380.field_2._M_allocated_capacity = *psVar7;
      local_380.field_2._8_8_ = plVar5[3];
      local_380._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_380.field_2._M_allocated_capacity = *psVar7;
      local_380._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_380._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    IssueMessage(this,INTERNAL_ERROR,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if (local_328[0] !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318) goto LAB_002c4106;
  }
  else {
    cmake::SetGlobalGenerator(&cm,gg);
    cmake::SetHomeDirectory(&cm,local_360);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    cmake::LoadCache(&cm);
    iVar3 = (*gg->_vptr_cmGlobalGenerator[0x1f])(gg);
    if ((char)iVar3 == '\0') {
      local_380._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"CMAKE_TRY_COMPILE_CONFIGURATION","");
      pcVar4 = GetDefinition(this,&local_380);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar1) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if (pcVar4 != (char *)0x0) {
        local_380._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"CMAKE_BUILD_TYPE","");
        cmake::AddCacheEntry(&cm,&local_380,pcVar4,"Build configuration",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != paVar1) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator(gg,this->GlobalGenerator,this);
    local_380._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    pcVar4 = GetDefinition(this,&local_380);
    bVar2 = cmSystemTools::IsOn(pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_380._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,&local_380,"TRUE","",4);
    }
    else {
      local_380._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,&local_380,"FALSE","",4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    iVar3 = cmake::Configure(&cm);
    if (iVar3 == 0) {
      iVar3 = cmake::Generate(&cm);
      if (iVar3 == 0) {
        iVar3 = cmGlobalGenerator::TryCompile
                          (this->GlobalGenerator,local_360,bindir,local_358,local_350,fast,output,
                           this);
        goto LAB_002c411d;
      }
      local_380._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"Failed to generate test project build system.","");
      IssueMessage(this,FATAL_ERROR,&local_380);
    }
    else {
      local_380._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,"Failed to configure test project build system.","");
      IssueMessage(this,FATAL_ERROR,&local_380);
    }
    local_318[0] = local_380.field_2._M_allocated_capacity;
    local_328[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_380._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
LAB_002c4106:
      operator_delete(local_328[0],local_318[0] + 1);
    }
  }
  cmSystemTools::s_FatalErrorOccured = true;
  iVar3 = 1;
LAB_002c411d:
  this->IsSourceFileTryCompile = false;
  cmake::~cmake(&cm);
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar3;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir.c_str());
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(cmake::INTERNAL_ERROR, "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorPlatform(this->GetCMakeInstance()->GetGeneratorPlatform());
  cm.SetGeneratorToolset(this->GetCMakeInstance()->GetGeneratorToolset());
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}